

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eq_Pos_Table.cpp
# Opt level: O0

vector<Position,_std::allocator<Position>_> * __thiscall
Eq_Pos_Table::get_equivalent_positions
          (vector<Position,_std::allocator<Position>_> *__return_storage_ptr__,Eq_Pos_Table *this,
          Color center_color,int flat_entry)

{
  code *pcVar1;
  reference pvVar2;
  int flat_entry_local;
  Color center_color_local;
  Eq_Pos_Table *this_local;
  
  switch(center_color) {
  case green:
    pvVar2 = std::
             vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ::operator[](&this->green_eq,(long)flat_entry);
    std::vector<Position,_std::allocator<Position>_>::vector(__return_storage_ptr__,pvVar2);
    break;
  case blue:
    pvVar2 = std::
             vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ::operator[](&this->blue_eq,(long)flat_entry);
    std::vector<Position,_std::allocator<Position>_>::vector(__return_storage_ptr__,pvVar2);
    break;
  case yellow:
    pvVar2 = std::
             vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ::operator[](&this->yellow_eq,(long)flat_entry);
    std::vector<Position,_std::allocator<Position>_>::vector(__return_storage_ptr__,pvVar2);
    break;
  case red:
    pvVar2 = std::
             vector<std::vector<Position,_std::allocator<Position>_>,_std::allocator<std::vector<Position,_std::allocator<Position>_>_>_>
             ::operator[](&this->red_eq,(long)flat_entry);
    std::vector<Position,_std::allocator<Position>_>::vector(__return_storage_ptr__,pvVar2);
    break;
  default:
    printf("Invalid color\n");
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Position> Eq_Pos_Table::get_equivalent_positions(Color center_color, int flat_entry){
    switch (center_color)
    {
    case Color::blue:
        return blue_eq[flat_entry];
        break;
    case Color::yellow:
        return yellow_eq[flat_entry];
        break;
    case Color::red:
        return red_eq[flat_entry];
        break;
    case Color::green:
        return green_eq[flat_entry];
        break;
    default:
        printf("Invalid color\n");
        break;
    }
}